

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O2

bool __thiscall clickhouse::TypeParser::Parse(TypeParser *this,TypeAst *type)

{
  TypeAst **__x;
  string_view __x_00;
  bool bVar1;
  _Elt_pointer ppTVar2;
  long lVar3;
  const_iterator cVar4;
  size_type sVar5;
  Meta MVar6;
  Code CVar7;
  stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  allocator<char> local_c1;
  Token local_c0;
  TypeAst local_a8;
  stack<clickhouse::TypeAst_*,_std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>_>
  *local_38;
  
  __x = &this->type_;
  this->type_ = type;
  this_00 = &this->open_elements_;
  std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::push_back
            (&this_00->c,__x);
  local_38 = this_00;
switchD_0015fbcc_default:
  paVar8 = &local_a8.name.field_2;
  NextToken(&local_c0,this);
  __x_00 = local_c0.value;
  switch(local_c0.type) {
  case Invalid:
    goto LAB_0015fe85;
  case Assign:
  case Comma:
    ppTVar2 = (this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar2 ==
        (this->open_elements_).c.
        super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppTVar2 = (this->open_elements_).c.
                super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    *__x = ppTVar2[-1];
    std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::pop_back(&this_00->c)
    ;
    local_a8.meta = Array;
    local_a8.code = Void;
    local_a8.name._M_string_length = 0;
    local_a8.value_string._M_string_length = 0;
    local_a8.value_string.field_2._8_8_ = 0;
    local_a8.name.field_2._8_8_ = 0;
    local_a8.value = 0;
    local_a8.name.field_2._M_allocated_capacity = 0;
    local_a8.value_string._M_dataplus._M_p = (pointer)&local_a8.value_string.field_2;
    local_a8.value_string.field_2._M_allocated_capacity = 0;
    local_a8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.name._M_dataplus._M_p = (pointer)paVar8;
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
    emplace_back<clickhouse::TypeAst>(&(*__x)->elements,&local_a8);
    break;
  case Name:
    __y._M_str = "Array";
    __y._M_len = 5;
    bVar1 = std::operator==(local_c0.value,__y);
    MVar6 = Array;
    if (!bVar1) {
      __y_00._M_str = "Null";
      __y_00._M_len = 4;
      bVar1 = std::operator==(__x_00,__y_00);
      MVar6 = Null;
      if (!bVar1) {
        __y_01._M_str = "Nullable";
        __y_01._M_len = 8;
        bVar1 = std::operator==(__x_00,__y_01);
        MVar6 = Nullable;
        if (!bVar1) {
          __y_02._M_str = "Tuple";
          __y_02._M_len = 5;
          bVar1 = std::operator==(__x_00,__y_02);
          MVar6 = Tuple;
          if (!bVar1) {
            __y_03._M_str = "Enum8";
            __y_03._M_len = 5;
            bVar1 = std::operator==(__x_00,__y_03);
            MVar6 = Enum;
            if (!bVar1) {
              __y_04._M_str = "Enum16";
              __y_04._M_len = 6;
              bVar1 = std::operator==(__x_00,__y_04);
              MVar6 = (uint)bVar1 * 2 + Terminal;
            }
          }
        }
      }
    }
    (*__x)->meta = MVar6;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_a8,&local_c0.value,&local_c1);
    std::__cxx11::string::operator=((string *)&(*__x)->name,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)kTypeCode_abi_cxx11_,&(*__x)->name);
    CVar7 = Void;
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_true>
        ._M_cur != (__node_type *)0x0) {
      CVar7 = *(Code *)((long)cVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::Type::Code>,_true>
                              ._M_cur + 0x28);
    }
    (*__x)->code = CVar7;
    this_00 = local_38;
    goto switchD_0015fbcc_default;
  case Number:
    (*__x)->meta = Number;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_a8,&local_c0.value,&local_c1);
    lVar3 = std::__cxx11::stol((string *)&local_a8,(size_t *)0x0,10);
    (*__x)->value = lVar3;
    goto LAB_0015fd44;
  case String:
    (*__x)->meta = String;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_a8,&local_c0.value,&local_c1);
    std::__cxx11::string::operator=((string *)&(*__x)->value_string,(string *)&local_a8);
LAB_0015fd44:
    std::__cxx11::string::~string((string *)&local_a8);
    goto switchD_0015fbcc_default;
  case LPar:
    local_a8.meta = Array;
    local_a8.code = Void;
    local_a8.name._M_string_length = 0;
    local_a8.value_string._M_string_length = 0;
    local_a8.value_string.field_2._8_8_ = 0;
    local_a8.name.field_2._8_8_ = 0;
    local_a8.value = 0;
    local_a8.name.field_2._M_allocated_capacity = 0;
    local_a8.value_string._M_dataplus._M_p = (pointer)&local_a8.value_string.field_2;
    local_a8.value_string.field_2._M_allocated_capacity = 0;
    local_a8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.elements.super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.name._M_dataplus._M_p = (pointer)paVar8;
    std::vector<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>::
    emplace_back<clickhouse::TypeAst>(&(*__x)->elements,&local_a8);
    break;
  case RPar:
    goto switchD_0015fbcc_caseD_6;
  case EOS:
    sVar5 = std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::size
                      (&this_00->c);
    return sVar5 == 1;
  default:
    goto switchD_0015fbcc_default;
  }
  TypeAst::~TypeAst(&local_a8);
  std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::push_back
            (&this_00->c,__x);
  *__x = ((*__x)->elements).
         super__Vector_base<clickhouse::TypeAst,_std::allocator<clickhouse::TypeAst>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  goto switchD_0015fbcc_default;
switchD_0015fbcc_caseD_6:
  ppTVar2 = (this->open_elements_).c.
            super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (ppTVar2 ==
      (this->open_elements_).c.
      super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppTVar2 = (this->open_elements_).c.
              super__Deque_base<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  *__x = ppTVar2[-1];
  std::deque<clickhouse::TypeAst_*,_std::allocator<clickhouse::TypeAst_*>_>::pop_back(&this_00->c);
  goto switchD_0015fbcc_default;
LAB_0015fe85:
  return false;
}

Assistant:

bool TypeParser::Parse(TypeAst* type) {
    type_ = type;
    open_elements_.push(type_);

    do {
        const Token& token = NextToken();

        switch (token.type) {
            case Token::Name:
                type_->meta = GetTypeMeta(token.value);
                type_->name = std::string(token.value);
                type_->code = GetTypeCode(type_->name);
                break;
            case Token::Number:
                type_->meta = TypeAst::Number;
                type_->value = std::stol(std::string(token.value));
                break;
            case Token::String:
                type_->meta = TypeAst::String;
                type_->value_string = std::string(token.value);
                break;
            case Token::LPar:
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::RPar:
                type_ = open_elements_.top();
                open_elements_.pop();
                break;
            case Token::Assign:
            case Token::Comma:
                type_ = open_elements_.top();
                open_elements_.pop();
                type_->elements.emplace_back(TypeAst());
                open_elements_.push(type_);
                type_ = &type_->elements.back();
                break;
            case Token::EOS:
                // Ubalanced braces, brackets, etc is an error.
                if (open_elements_.size() != 1) {
                    return false;
                }
                return true;
            case Token::Invalid:
                return false;
        }
    } while (true);
}